

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

int SoapySDRDevice_setGain(SoapySDRDevice *device,int direction,size_t channel,double value)

{
  undefined1 *puVar1;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_00141f38);
  *(undefined4 *)(puVar1 + 0x400) = 0;
  *puVar1 = 0;
  (**(code **)(*(long *)device + 0x170))(value,device,direction,channel);
  return 0;
}

Assistant:

int SoapySDRDevice_setGain(SoapySDRDevice *device, const int direction, const size_t channel, const double value)
{
    __SOAPY_SDR_C_TRY
    device->setGain(direction, channel, value);
    __SOAPY_SDR_C_CATCH
}